

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O2

char * Cba_ManGetSliceName(Cba_Ntk_t *p,int iFon,int RangeId)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  Vec_Str_t *p_00;
  char *pcVar5;
  
  uVar1 = Cba_NtkRangeLeft(p,RangeId);
  uVar2 = Cba_NtkRangeRight(p,RangeId);
  pcVar4 = Cba_FonNameStr(p,iFon);
  iVar3 = Cba_FonName(p,iFon);
  iVar3 = Cba_NameIsLegalInVerilog(pcVar4,iVar3);
  p_00 = Abc_NamBuffer(p->pDesign->pStrs);
  if (iVar3 == 0) {
    if (uVar1 != uVar2) {
      pcVar5 = "\\%s [%d:%d]";
      goto LAB_002ef446;
    }
    pcVar5 = "\\%s [%d]";
  }
  else {
    if (uVar1 != uVar2) {
      pcVar5 = "%s[%d:%d]";
LAB_002ef446:
      pcVar4 = Vec_StrPrintF(p_00,pcVar5,pcVar4,(ulong)uVar1,(ulong)uVar2);
      return pcVar4;
    }
    pcVar5 = "%s[%d]";
  }
  pcVar4 = Vec_StrPrintF(p_00,pcVar5,pcVar4,(ulong)uVar1);
  return pcVar4;
}

Assistant:

char * Cba_ManGetSliceName( Cba_Ntk_t * p, int iFon, int RangeId )
{
    int Left  = Cba_NtkRangeLeft(p, RangeId);
    int Right = Cba_NtkRangeRight(p, RangeId);
    char * pName = Cba_FonNameStr(p, iFon);
    if ( Cba_NameIsLegalInVerilog(pName, Cba_FonName(p, iFon)) )
        if ( Left == Right )
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "%s[%d]", pName, Right );
        else
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "%s[%d:%d]", pName, Left, Right );
    else
        if ( Left == Right )
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s [%d]", pName, Right );
        else
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s [%d:%d]", pName, Left, Right );
}